

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

void slang::ast::UnrollVisitor::run(ASTContext *astCtx,ForLoopStatement *loop)

{
  bool bVar1;
  UnrollVisitor visitor;
  UnrollVisitor UStack_3a8;
  
  UnrollVisitor(&UStack_3a8,astCtx);
  ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false>::
  visit<slang::ast::ForLoopStatement>
            ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false> *)&UStack_3a8,loop);
  bVar1 = std::ranges::__any_of_fn::
          operator()<boost::unordered::unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_statements_LoopStatements_cpp:126:33)>
                    ((__any_of_fn *)&std::ranges::any_of,&UStack_3a8.driverMap);
  if (bVar1) {
    runForReal(&UStack_3a8,loop);
  }
  ~UnrollVisitor(&UStack_3a8);
  return;
}

Assistant:

static void run(const ASTContext& astCtx, const ForLoopStatement& loop) {
        UnrollVisitor visitor(astCtx);
        visitor.visit(loop);

        if (std::ranges::any_of(visitor.driverMap,
                                [](auto& item) { return !item.second->empty(); })) {
            visitor.runForReal(loop);
        }
    }